

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

RunContext * __thiscall Catch::RunContext::getCurrentTestName_abi_cxx11_(RunContext *this)

{
  long in_RSI;
  allocator local_19 [9];
  RunContext *this_local;
  
  this_local = this;
  if (*(long *)(in_RSI + 0x80) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",local_19);
    std::allocator<char>::~allocator((allocator<char> *)local_19);
  }
  else {
    std::__cxx11::string::string((string *)this,*(string **)(in_RSI + 0x80));
  }
  return this;
}

Assistant:

virtual std::string getCurrentTestName() const CATCH_OVERRIDE {
            return m_activeTestCaseInfo
                ? m_activeTestCaseInfo->name
                : "";
        }